

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArticulatedPart.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::ArticulatedPart::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,ArticulatedPart *this)

{
  ArticulatedPartsMetric AVar1;
  ArticulatedPartsClass AVar2;
  ostream *poVar3;
  KINT32 Value;
  KINT32 Value_00;
  KString local_1f0;
  KString local_1d0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  ArticulatedPart *local_18;
  ArticulatedPart *this_local;
  
  local_18 = this;
  this_local = (ArticulatedPart *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar3 = std::operator<<(local_190,"Articulation Parameters:");
  poVar3 = std::operator<<(poVar3,"\n\tParameter Change:     ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ushort)this->m_ui8ParmeterChange);
  poVar3 = std::operator<<(poVar3,"\n\tAttachement ID:       ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->m_ui16AttachementID);
  poVar3 = std::operator<<(poVar3,"\n\tType Metric:          ");
  AVar1 = GetTypeVariantMetric(this);
  ENUMS::GetEnumAsStringArticulatedPartsMetric_abi_cxx11_(&local_1d0,(ENUMS *)(ulong)AVar1,Value);
  poVar3 = std::operator<<(poVar3,(string *)&local_1d0);
  poVar3 = std::operator<<(poVar3,"\n\tType High Bits:       ");
  AVar2 = GetTypeVariantClass(this);
  ENUMS::GetEnumAsStringArticulatedPartsClass_abi_cxx11_(&local_1f0,(ENUMS *)(ulong)AVar2,Value_00);
  poVar3 = std::operator<<(poVar3,(string *)&local_1f0);
  poVar3 = std::operator<<(poVar3,"\n\tValue:                ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(float)this->m_f32ParamValue);
  std::operator<<(poVar3,"\n");
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString ArticulatedPart::GetAsString() const
{
    KStringStream ss;

    ss << "Articulation Parameters:"
       << "\n\tParameter Change:     " << ( KUINT16 )m_ui8ParmeterChange
       << "\n\tAttachement ID:       " << m_ui16AttachementID
       << "\n\tType Metric:          " << GetEnumAsStringArticulatedPartsMetric( GetTypeVariantMetric() )
       << "\n\tType High Bits:       " << GetEnumAsStringArticulatedPartsClass( GetTypeVariantClass() )
       << "\n\tValue:                " << m_f32ParamValue
       << "\n";

    return ss.str();
}